

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQHash sq_gethash(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if ((int)SVar1 < 0x5000004) {
    if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
      return (SQHash)(pSVar2->super_SQObject)._unVal.pTable;
    }
  }
  else {
    if (SVar1 == OT_FLOAT) {
      return (long)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    if (SVar1 == OT_STRING) {
      return (SQHash)(((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate;
    }
  }
  return (pSVar2->super_SQObject)._unVal.nInteger >> 3;
}

Assistant:

SQHash sq_gethash(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    return HashObj(o);
}